

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O3

void OnGamefieldClick(Gamefield *gamefield,MousePos pos)

{
  uint uVar1;
  double dVar2;
  int iVar3;
  byte bVar4;
  PixelType type;
  IntVec2 coords;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = gamefield->height;
  bVar4 = GetCurrentPixelsRadius();
  type = GetCurrentPixelType();
  dVar2 = (double)bVar4;
  dVar7 = dVar2 + pos.x;
  dVar8 = pos.x - dVar2;
  if ((double)(int)dVar8 < dVar7) {
    iVar5 = (int)dVar8;
    dVar8 = (double)uVar1 - pos.y;
    iVar6 = (int)(dVar8 - dVar2);
    iVar3 = iVar6;
    do {
      for (; (double)iVar3 < dVar8 + dVar2; iVar3 = iVar3 + 1) {
        coords.y = iVar3;
        coords.x = iVar5;
        CreatePixel(gamefield,coords,type);
      }
      iVar5 = iVar5 + 1;
      iVar3 = iVar6;
    } while ((double)iVar5 < dVar7);
  }
  if ((type < (Fire|Water)) && ((0x5bU >> (type & 0x1f) & 1) != 0)) {
    AudioManagerPlaySoundOnce(*(SoundType *)(&DAT_0015fc68 + (ulong)type * 4));
    return;
  }
  return;
}

Assistant:

void OnGamefieldClick(Gamefield* gamefield, MousePos pos) {
    pos.y = gamefield->height - pos.y;
    IntVec2 coords;

    uint8_t radius = GetCurrentPixelsRadius();
    PixelType pixelType = GetCurrentPixelType();

    for (int width = pos.x - radius; width < pos.x + radius; width++) {
        for (int height = pos.y - radius; height < pos.y + radius; height++) {
            coords.x = width;
            coords.y = height;
            CreatePixel(gamefield, coords, pixelType);
        }
    }

    switch (pixelType) {
        case Sand:
            AudioManagerPlaySoundOnce(SandSpawn);
            break;
        case Plant:
            AudioManagerPlaySoundOnce(PlantSpawn);
            break;
        case Water:
            AudioManagerPlaySoundOnce(WaterSpawn);
            break;
        case Stone:
            AudioManagerPlaySoundOnce(StoneSpawn);
            break;
        case Fire:
            AudioManagerPlaySoundOnce(FireSpawn);
            break;
    }
}